

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QString,VcsolutionDepend*>::emplace_helper<VcsolutionDepend*const&>
          (QHash<QString,VcsolutionDepend*> *this,QString *key,VcsolutionDepend **args)

{
  byte bVar1;
  Entry *pEVar2;
  piter pVar3;
  long in_FS_OFFSET;
  InsertionResult local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.initialized = true;
  local_38._17_7_ = 0xaaaaaaaaaaaaaa;
  local_38.it.d = (Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *)0xaaaaaaaaaaaaaaaa;
  local_38.it.bucket = 0xaaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_>::findOrInsert<QString>
            (&local_38,*(Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> **)this,key);
  pEVar2 = (local_38.it.d)->spans[local_38.it.bucket >> 7].entries;
  bVar1 = (local_38.it.d)->spans[local_38.it.bucket >> 7].offsets[(uint)local_38.it.bucket & 0x7f];
  if (local_38.initialized == false) {
    QHashPrivate::Node<QString,VcsolutionDepend*>::createInPlace<VcsolutionDepend*const&>
              ((Node<QString,_VcsolutionDepend_*> *)(pEVar2 + bVar1),key,args);
  }
  else {
    *(VcsolutionDepend **)(pEVar2[bVar1].storage.data + 0x18) = *args;
  }
  pVar3.bucket = local_38.it.bucket;
  pVar3.d = local_38.it.d;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }